

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::GetApproxQuantileDecimal(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction *in_RDI;
  aggregate_window_t unaff_retaddr;
  aggregate_serialize_t in_stack_00000008;
  aggregate_deserialize_t in_stack_00000010;
  AggregateFunction *fun;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  LogicalType *local_c0;
  aggregate_update_t in_stack_ffffffffffffff68;
  aggregate_initialize_t in_stack_ffffffffffffff70;
  aggregate_size_t in_stack_ffffffffffffff78;
  LogicalType *in_stack_ffffffffffffff80;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  AggregateFunction *this;
  LogicalType local_68 [24];
  undefined1 local_50 [24];
  LogicalType *local_38;
  aggregate_combine_t combine;
  aggregate_finalize_t in_stack_ffffffffffffffd8;
  aggregate_simple_update_t in_stack_ffffffffffffffe0;
  bind_aggregate_function_t in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  AggregateFunction *statistics;
  
  uVar2 = 0;
  statistics = in_RDI;
  duckdb::LogicalType::LogicalType(local_68,DECIMAL);
  this = (AggregateFunction *)local_50;
  duckdb::LogicalType::LogicalType((LogicalType *)this,FLOAT);
  local_38 = local_68;
  combine = (aggregate_combine_t)0x2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9b8123);
  iVar1._M_len = in_stack_fffffffffffffed0;
  iVar1._M_array = in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffec0,iVar1,in_stack_fffffffffffffeb8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff68,DECIMAL);
  AggregateFunction::AggregateFunction
            (this,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,combine,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
             (aggregate_destructor_t)CONCAT17(uVar2,in_stack_fffffffffffffff0),
             (aggregate_statistics_t)statistics,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff68);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9b81f7);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9b8204);
  local_c0 = (LogicalType *)&local_38;
  do {
    local_c0 = local_c0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_c0);
  } while (local_c0 != local_68);
  in_RDI->serialize = ApproximateQuantileBindData::Serialize;
  in_RDI->deserialize = ApproxQuantileDecimalDeserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetApproxQuantileDecimal() {
	// stub function - the actual function is set during bind or deserialize
	AggregateFunction fun({LogicalTypeId::DECIMAL, LogicalType::FLOAT}, LogicalTypeId::DECIMAL, nullptr, nullptr,
	                      nullptr, nullptr, nullptr, nullptr, BindApproxQuantileDecimal);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproxQuantileDecimalDeserialize;
	return fun;
}